

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O0

void replace_backslash_doublequote_dollar(char *s)

{
  bool bVar1;
  char *b;
  char *a;
  char *s_local;
  
  b = s + 1;
  a = s;
  while( true ) {
    bVar1 = false;
    if (*a != '\0') {
      bVar1 = *b != '\0';
    }
    if (!bVar1) break;
    if ((*a == '\\') && (*b == '\"')) {
      *b = '$';
    }
    a = a + 1;
    b = b + 1;
  }
  return;
}

Assistant:

static void replace_backslash_doublequote_dollar(char* s)
{
    char* a = s;
    char* b = s + 1;
    while (*a && *b)
    {
        if (*a == '\\' && *b == '\"')
        {
            *b = '$';
        }

        a++;
        b++;
    }
}